

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O1

void __thiscall Refal2::CArbitraryInteger::mul(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  pointer puVar1;
  TDigit *pTVar2;
  CArbitraryInteger *this_00;
  iterator i;
  TDigit *pTVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  CArbitraryInteger tmp_1;
  TDigit *local_70;
  TDigit *local_68;
  CArbitraryInteger local_58;
  pointer local_38;
  
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_70,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)&local_58);
  puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar1;
  }
  local_58.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)local_58.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  this_00 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             ((long)(operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) + ((long)local_68 - (long)local_70 >> 2),
             (value_type *)&local_58);
  if (local_70 != local_68) {
    i._M_current = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
    pTVar3 = local_70;
    do {
      local_38 = i._M_current;
      for (pTVar2 = (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pTVar2 != (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish; pTVar2 = pTVar2 + 1) {
        local_58.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_58.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.isNegative = false;
        mulDigitDigit(this_00,*pTVar3,*pTVar2,&local_58);
        add(this,i,&local_58);
        this_00 = (CArbitraryInteger *)
                  local_58.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((CArbitraryInteger *)
            local_58.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (CArbitraryInteger *)0x0) {
          operator_delete(local_58.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        i._M_current = i._M_current + 1;
      }
      pTVar3 = pTVar3 + 1;
      i._M_current = local_38 + 1;
    } while (pTVar3 != local_68);
  }
  if (local_70 != (TDigit *)0x0) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void CArbitraryInteger::mul( const CArbitraryInteger& operand )
{
	std::vector<value_type> tmp( cbegin(), cend() );
	clear();
	resize( tmp.size() + operand.size(), 0 );
	iterator firstDigit = begin();
	for( const_iterator i = tmp.cbegin(); i != tmp.cend(); ++i, ++firstDigit ) {
		iterator currentDigit = firstDigit;
		for( const_iterator j = operand.cbegin(); j != operand.cend(); ++j ) {
			CArbitraryInteger tmp;
			mulDigitDigit( *i, *j, tmp );
			add( currentDigit, tmp );
			++currentDigit;
		}
	}
}